

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VConst_Serial(sunrealtype c,N_Vector z)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar3 = _DAT_00138040;
  lVar1 = *z->content;
  if (0 < lVar1) {
    lVar2 = *(long *)((long)z->content + 0x10);
    lVar4 = lVar1 + -1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00138040;
    auVar7 = _DAT_00138030;
    do {
      auVar8 = auVar7 ^ auVar3;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(sunrealtype *)(lVar2 + uVar5 * 8) = c;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(sunrealtype *)(lVar2 + 8 + uVar5 * 8) = c;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
    } while ((lVar1 + 1U & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

void N_VConst_Serial(sunrealtype c, N_Vector z)
{
  sunindextype i, N;
  sunrealtype* zd;

  zd = NULL;

  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = c; }

  return;
}